

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitThrow
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,Throw *curr)

{
  long lVar1;
  Literal *other;
  long lVar2;
  long lVar3;
  undefined1 local_e0 [8];
  value_type item;
  SmallVector<wasm::Literal,_1UL> local_b8;
  undefined1 auStack_78 [8];
  Literals arguments;
  
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
  _M_str = (char *)0x0;
  auStack_78 = (undefined1  [8])0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  generateArguments(__return_storage_ptr__,this,&curr->operands,(Literals *)auStack_78);
  if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0) {
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    Literal::~Literal((Literal *)&arguments);
    return __return_storage_ptr__;
  }
  local_b8.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.fixed._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  local_b8.fixed._M_elems[0].type.id = 0;
  local_b8.usedFixed = 0;
  local_b8.fixed._M_elems[0].field_0.i64 = 0;
  local_b8.flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  item.type.id = (curr->tag).super_IString.str._M_len;
  lVar1 = ((long)((long)arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_start -
                 arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
          -0x5555555555555555 + (long)auStack_78;
  if (lVar1 != 0) {
    lVar3 = -0x18;
    lVar2 = 0;
    do {
      other = (Literal *)
              (arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id + lVar3);
      if (lVar2 == 0) {
        other = (Literal *)&arguments;
      }
      Literal::Literal((Literal *)local_e0,other);
      SmallVector<wasm::Literal,_1UL>::push_back(&local_b8,(Literal *)local_e0);
      Literal::~Literal((Literal *)local_e0);
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x18;
    } while (lVar1 != lVar2);
  }
  (*this->_vptr_ExpressionRunner[4])(this,&item.type);
  handle_unreachable("throw",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                     ,0x56c);
}

Assistant:

Flow visitThrow(Throw* curr) {
    NOTE_ENTER("Throw");
    Literals arguments;
    Flow flow = generateArguments(curr->operands, arguments);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(curr->tag);
    WasmException exn;
    exn.tag = curr->tag;
    for (auto item : arguments) {
      exn.values.push_back(item);
    }
    throwException(exn);
    WASM_UNREACHABLE("throw");
  }